

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O2

void conv_fmt_16bit_c(uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
                     int src_stridec,int *dst_stride,int uv_shift)

{
  int iVar1;
  uchar *puVar2;
  uint uVar3;
  ulong uVar4;
  uchar *puVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  bool bVar10;
  
  puVar5 = *dst;
  iVar1 = *dst_stride;
  iVar9 = 0;
  if (0 < height) {
    iVar9 = height;
  }
  while (bVar10 = iVar9 != 0, iVar9 = iVar9 + -1, bVar10) {
    memcpy(puVar5,src_y,(long)(width * 2));
    src_y = src_y + (long)(src_stride >> 1) * 2;
    puVar5 = puVar5 + (long)(iVar1 >> 1) * 2;
  }
  uVar3 = width >> ((byte)uv_shift & 0x1f);
  iVar8 = height >> ((byte)uv_shift & 0x1f);
  puVar5 = dst[1];
  iVar1 = dst_stride[1];
  iVar9 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = 0;
  }
  if (iVar8 < 1) {
    iVar8 = 0;
  }
  puVar2 = src_uv;
  for (; iVar9 != iVar8; iVar9 = iVar9 + 1) {
    for (uVar7 = 0; (uint)((int)uVar4 * 2) != uVar7; uVar7 = uVar7 + 2) {
      *(undefined2 *)(puVar5 + uVar7) = *(undefined2 *)(puVar2 + (long)(int)uVar7 * 2);
    }
    puVar2 = puVar2 + (long)(src_stridec >> 1) * 2;
    puVar5 = puVar5 + (long)(iVar1 >> 1) * 2;
  }
  puVar5 = src_uv + 2;
  puVar2 = dst[2];
  iVar1 = dst_stride[2];
  for (iVar9 = 0; iVar9 != iVar8; iVar9 = iVar9 + 1) {
    for (lVar6 = 0; uVar4 * 2 != lVar6; lVar6 = lVar6 + 2) {
      *(undefined2 *)(puVar2 + lVar6) = *(undefined2 *)(puVar5 + (long)(int)lVar6 * 2);
    }
    puVar5 = puVar5 + (long)(src_stridec >> 1) * 2;
    puVar2 = puVar2 + (long)(iVar1 >> 1) * 2;
  }
  return;
}

Assistant:

static void conv_fmt_16bit_c(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift) {
    int i, j;
    short* psrc = (short*)src_y;
    short* pdst = (short*)dst[0];
    int width2 = width << 1;
    int i_src = src_stride >> 1;
    int i_dst = dst_stride[0] >> 1;

    for (i = 0; i < height; i++) {
        memcpy(pdst, psrc, width2);
        psrc += i_src;
        pdst += i_dst;
    }

    width >>= uv_shift;
    height >>= uv_shift;

    psrc = (short*)src_uv;
    pdst = (short*)dst[1];
    i_src = src_stridec >> 1;
    i_dst = dst_stride[1] >> 1;
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    psrc = ((short*)src_uv) + 1;
    pdst = (short*)dst[2];
    i_dst = dst_stride[2] >> 1;
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }
}